

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

void __thiscall HighsMipSolverData::removeFixedIndices(HighsMipSolverData *this)

{
  int iVar1;
  const_iterator cVar2;
  pointer pdVar3;
  pointer pdVar4;
  int *piVar5;
  long lVar6;
  const_iterator cVar7;
  long lVar8;
  
  piVar5 = (this->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  cVar2._M_current =
       (this->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar8 = (long)cVar2._M_current - (long)piVar5;
  pdVar3 = (this->domain).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->domain).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar6 = lVar8 >> 4; 0 < lVar6; lVar6 = lVar6 + -1) {
    if ((pdVar3[*piVar5] == pdVar4[*piVar5]) && (!NAN(pdVar3[*piVar5]) && !NAN(pdVar4[*piVar5])))
    goto LAB_002c14eb;
    if ((pdVar3[piVar5[1]] == pdVar4[piVar5[1]]) &&
       (!NAN(pdVar3[piVar5[1]]) && !NAN(pdVar4[piVar5[1]]))) {
      piVar5 = piVar5 + 1;
      goto LAB_002c14eb;
    }
    if ((pdVar3[piVar5[2]] == pdVar4[piVar5[2]]) &&
       (!NAN(pdVar3[piVar5[2]]) && !NAN(pdVar4[piVar5[2]]))) {
      piVar5 = piVar5 + 2;
      goto LAB_002c14eb;
    }
    if ((pdVar3[piVar5[3]] == pdVar4[piVar5[3]]) &&
       (!NAN(pdVar3[piVar5[3]]) && !NAN(pdVar4[piVar5[3]]))) {
      piVar5 = piVar5 + 3;
      goto LAB_002c14eb;
    }
    piVar5 = piVar5 + 4;
    lVar8 = lVar8 + -0x10;
  }
  lVar8 = lVar8 >> 2;
  cVar7._M_current = cVar2._M_current;
  if (lVar8 == 1) {
LAB_002c14c4:
    if ((pdVar3[*piVar5] == pdVar4[*piVar5]) && (!NAN(pdVar3[*piVar5]) && !NAN(pdVar4[*piVar5])))
    goto LAB_002c14eb;
  }
  else {
    if (lVar8 == 2) {
LAB_002c14ae:
      if ((pdVar3[*piVar5] != pdVar4[*piVar5]) || (NAN(pdVar3[*piVar5]) || NAN(pdVar4[*piVar5]))) {
        piVar5 = piVar5 + 1;
        goto LAB_002c14c4;
      }
    }
    else {
      if (lVar8 != 3) goto LAB_002c1523;
      if ((pdVar3[*piVar5] != pdVar4[*piVar5]) || (NAN(pdVar3[*piVar5]) || NAN(pdVar4[*piVar5]))) {
        piVar5 = piVar5 + 1;
        goto LAB_002c14ae;
      }
    }
LAB_002c14eb:
    cVar7._M_current = piVar5;
    if (piVar5 != cVar2._M_current) {
      while (piVar5 = piVar5 + 1, piVar5 != cVar2._M_current) {
        iVar1 = *piVar5;
        if ((pdVar3[iVar1] != pdVar4[iVar1]) || (NAN(pdVar3[iVar1]) || NAN(pdVar4[iVar1]))) {
          *cVar7._M_current = iVar1;
          cVar7._M_current = cVar7._M_current + 1;
        }
      }
    }
  }
LAB_002c1523:
  std::vector<int,_std::allocator<int>_>::erase(&this->integral_cols,cVar7,cVar2);
  piVar5 = (this->integer_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  cVar2._M_current =
       (this->integer_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar8 = (long)cVar2._M_current - (long)piVar5;
  pdVar3 = (this->domain).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->domain).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar6 = lVar8 >> 4; 0 < lVar6; lVar6 = lVar6 + -1) {
    if ((pdVar3[*piVar5] == pdVar4[*piVar5]) && (!NAN(pdVar3[*piVar5]) && !NAN(pdVar4[*piVar5])))
    goto LAB_002c1635;
    if ((pdVar3[piVar5[1]] == pdVar4[piVar5[1]]) &&
       (!NAN(pdVar3[piVar5[1]]) && !NAN(pdVar4[piVar5[1]]))) {
      piVar5 = piVar5 + 1;
      goto LAB_002c1635;
    }
    if ((pdVar3[piVar5[2]] == pdVar4[piVar5[2]]) &&
       (!NAN(pdVar3[piVar5[2]]) && !NAN(pdVar4[piVar5[2]]))) {
      piVar5 = piVar5 + 2;
      goto LAB_002c1635;
    }
    if ((pdVar3[piVar5[3]] == pdVar4[piVar5[3]]) &&
       (!NAN(pdVar3[piVar5[3]]) && !NAN(pdVar4[piVar5[3]]))) {
      piVar5 = piVar5 + 3;
      goto LAB_002c1635;
    }
    piVar5 = piVar5 + 4;
    lVar8 = lVar8 + -0x10;
  }
  lVar8 = lVar8 >> 2;
  cVar7._M_current = cVar2._M_current;
  if (lVar8 == 1) {
LAB_002c160e:
    if ((pdVar3[*piVar5] == pdVar4[*piVar5]) && (!NAN(pdVar3[*piVar5]) && !NAN(pdVar4[*piVar5])))
    goto LAB_002c1635;
  }
  else {
    if (lVar8 == 2) {
LAB_002c15f8:
      if ((pdVar3[*piVar5] != pdVar4[*piVar5]) || (NAN(pdVar3[*piVar5]) || NAN(pdVar4[*piVar5]))) {
        piVar5 = piVar5 + 1;
        goto LAB_002c160e;
      }
    }
    else {
      if (lVar8 != 3) goto LAB_002c166d;
      if ((pdVar3[*piVar5] != pdVar4[*piVar5]) || (NAN(pdVar3[*piVar5]) || NAN(pdVar4[*piVar5]))) {
        piVar5 = piVar5 + 1;
        goto LAB_002c15f8;
      }
    }
LAB_002c1635:
    cVar7._M_current = piVar5;
    if (piVar5 != cVar2._M_current) {
      while (piVar5 = piVar5 + 1, piVar5 != cVar2._M_current) {
        iVar1 = *piVar5;
        if ((pdVar3[iVar1] != pdVar4[iVar1]) || (NAN(pdVar3[iVar1]) || NAN(pdVar4[iVar1]))) {
          *cVar7._M_current = iVar1;
          cVar7._M_current = cVar7._M_current + 1;
        }
      }
    }
  }
LAB_002c166d:
  std::vector<int,_std::allocator<int>_>::erase(&this->integer_cols,cVar7,cVar2);
  piVar5 = (this->implint_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  cVar2._M_current =
       (this->implint_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar8 = (long)cVar2._M_current - (long)piVar5;
  pdVar3 = (this->domain).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->domain).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar6 = lVar8 >> 4; 0 < lVar6; lVar6 = lVar6 + -1) {
    if ((pdVar3[*piVar5] == pdVar4[*piVar5]) && (!NAN(pdVar3[*piVar5]) && !NAN(pdVar4[*piVar5])))
    goto LAB_002c177f;
    if ((pdVar3[piVar5[1]] == pdVar4[piVar5[1]]) &&
       (!NAN(pdVar3[piVar5[1]]) && !NAN(pdVar4[piVar5[1]]))) {
      piVar5 = piVar5 + 1;
      goto LAB_002c177f;
    }
    if ((pdVar3[piVar5[2]] == pdVar4[piVar5[2]]) &&
       (!NAN(pdVar3[piVar5[2]]) && !NAN(pdVar4[piVar5[2]]))) {
      piVar5 = piVar5 + 2;
      goto LAB_002c177f;
    }
    if ((pdVar3[piVar5[3]] == pdVar4[piVar5[3]]) &&
       (!NAN(pdVar3[piVar5[3]]) && !NAN(pdVar4[piVar5[3]]))) {
      piVar5 = piVar5 + 3;
      goto LAB_002c177f;
    }
    piVar5 = piVar5 + 4;
    lVar8 = lVar8 + -0x10;
  }
  lVar8 = lVar8 >> 2;
  cVar7._M_current = cVar2._M_current;
  if (lVar8 == 1) {
LAB_002c1758:
    if ((pdVar3[*piVar5] == pdVar4[*piVar5]) && (!NAN(pdVar3[*piVar5]) && !NAN(pdVar4[*piVar5])))
    goto LAB_002c177f;
  }
  else {
    if (lVar8 == 2) {
LAB_002c1742:
      if ((pdVar3[*piVar5] != pdVar4[*piVar5]) || (NAN(pdVar3[*piVar5]) || NAN(pdVar4[*piVar5]))) {
        piVar5 = piVar5 + 1;
        goto LAB_002c1758;
      }
    }
    else {
      if (lVar8 != 3) goto LAB_002c17b7;
      if ((pdVar3[*piVar5] != pdVar4[*piVar5]) || (NAN(pdVar3[*piVar5]) || NAN(pdVar4[*piVar5]))) {
        piVar5 = piVar5 + 1;
        goto LAB_002c1742;
      }
    }
LAB_002c177f:
    cVar7._M_current = piVar5;
    if (piVar5 != cVar2._M_current) {
      while (piVar5 = piVar5 + 1, piVar5 != cVar2._M_current) {
        iVar1 = *piVar5;
        if ((pdVar3[iVar1] != pdVar4[iVar1]) || (NAN(pdVar3[iVar1]) || NAN(pdVar4[iVar1]))) {
          *cVar7._M_current = iVar1;
          cVar7._M_current = cVar7._M_current + 1;
        }
      }
    }
  }
LAB_002c17b7:
  std::vector<int,_std::allocator<int>_>::erase(&this->implint_cols,cVar7,cVar2);
  piVar5 = (this->continuous_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  cVar2._M_current =
       (this->continuous_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar8 = (long)cVar2._M_current - (long)piVar5;
  pdVar3 = (this->domain).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->domain).col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar6 = lVar8 >> 4; 0 < lVar6; lVar6 = lVar6 + -1) {
    if ((pdVar3[*piVar5] == pdVar4[*piVar5]) && (!NAN(pdVar3[*piVar5]) && !NAN(pdVar4[*piVar5])))
    goto LAB_002c18c9;
    if ((pdVar3[piVar5[1]] == pdVar4[piVar5[1]]) &&
       (!NAN(pdVar3[piVar5[1]]) && !NAN(pdVar4[piVar5[1]]))) {
      piVar5 = piVar5 + 1;
      goto LAB_002c18c9;
    }
    if ((pdVar3[piVar5[2]] == pdVar4[piVar5[2]]) &&
       (!NAN(pdVar3[piVar5[2]]) && !NAN(pdVar4[piVar5[2]]))) {
      piVar5 = piVar5 + 2;
      goto LAB_002c18c9;
    }
    if ((pdVar3[piVar5[3]] == pdVar4[piVar5[3]]) &&
       (!NAN(pdVar3[piVar5[3]]) && !NAN(pdVar4[piVar5[3]]))) {
      piVar5 = piVar5 + 3;
      goto LAB_002c18c9;
    }
    piVar5 = piVar5 + 4;
    lVar8 = lVar8 + -0x10;
  }
  lVar8 = lVar8 >> 2;
  cVar7._M_current = cVar2._M_current;
  if (lVar8 == 1) {
LAB_002c18a2:
    if ((pdVar3[*piVar5] != pdVar4[*piVar5]) || (NAN(pdVar3[*piVar5]) || NAN(pdVar4[*piVar5])))
    goto LAB_002c1901;
  }
  else if (lVar8 == 2) {
LAB_002c188c:
    if ((pdVar3[*piVar5] != pdVar4[*piVar5]) || (NAN(pdVar3[*piVar5]) || NAN(pdVar4[*piVar5]))) {
      piVar5 = piVar5 + 1;
      goto LAB_002c18a2;
    }
  }
  else {
    if (lVar8 != 3) goto LAB_002c1901;
    if ((pdVar3[*piVar5] != pdVar4[*piVar5]) || (NAN(pdVar3[*piVar5]) || NAN(pdVar4[*piVar5]))) {
      piVar5 = piVar5 + 1;
      goto LAB_002c188c;
    }
  }
LAB_002c18c9:
  cVar7._M_current = piVar5;
  if (piVar5 != cVar2._M_current) {
    while (piVar5 = piVar5 + 1, piVar5 != cVar2._M_current) {
      iVar1 = *piVar5;
      if ((pdVar3[iVar1] != pdVar4[iVar1]) || (NAN(pdVar3[iVar1]) || NAN(pdVar4[iVar1]))) {
        *cVar7._M_current = iVar1;
        cVar7._M_current = cVar7._M_current + 1;
      }
    }
  }
LAB_002c1901:
  std::vector<int,_std::allocator<int>_>::erase(&this->continuous_cols,cVar7,cVar2);
  return;
}

Assistant:

void HighsMipSolverData::removeFixedIndices() {
  integral_cols.erase(
      std::remove_if(integral_cols.begin(), integral_cols.end(),
                     [&](HighsInt col) { return domain.isFixed(col); }),
      integral_cols.end());
  integer_cols.erase(
      std::remove_if(integer_cols.begin(), integer_cols.end(),
                     [&](HighsInt col) { return domain.isFixed(col); }),
      integer_cols.end());
  implint_cols.erase(
      std::remove_if(implint_cols.begin(), implint_cols.end(),
                     [&](HighsInt col) { return domain.isFixed(col); }),
      implint_cols.end());
  continuous_cols.erase(
      std::remove_if(continuous_cols.begin(), continuous_cols.end(),
                     [&](HighsInt col) { return domain.isFixed(col); }),
      continuous_cols.end());
}